

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkBddToMuxes(Abc_Ntk_t *pNtk,int fGlobal,int Limit)

{
  int iVar1;
  char *value;
  long *plVar2;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  Abc_Ntk_t *pNtkNew;
  DdManager *pDVar7;
  st__table *psVar8;
  DdNode *pDVar9;
  void *pvVar10;
  undefined8 uVar11;
  Abc_Obj_t *pAVar12;
  Vec_Ptr_t *pVVar13;
  ProgressBar *p;
  int iVar14;
  long lVar15;
  long lVar16;
  
  pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  if (fGlobal == 0) {
    if ((pNtk->ntkFunc != ABC_FUNC_BDD) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
      __assert_fail("Abc_NtkIsBddLogic(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNtbdd.c"
                    ,0xb0,"void Abc_NtkBddToMuxesPerform(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    pVVar13 = Abc_NtkDfs(pNtk,0);
    p = Extra_ProgressBarStart(_stdout,pVVar13->nSize);
    if (0 < pVVar13->nSize) {
      lVar15 = 0;
      do {
        plVar2 = (long *)pVVar13->pArray[lVar15];
        if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar15)) {
          Extra_ProgressBarUpdate_int(p,(int)lVar15,(char *)0x0);
        }
        if ((*(uint *)((long)plVar2 + 0x14) & 0xf) != 7) {
          __assert_fail("Abc_ObjIsNode(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNtbdd.c"
                        ,0xb8,"void Abc_NtkBddToMuxesPerform(Abc_Ntk_t *, Abc_Ntk_t *)");
        }
        uVar4 = plVar2[7];
        pDVar7 = *(DdManager **)(*plVar2 + 0x100);
        psVar8 = st__init_table(st__ptrcmp,st__ptrhash);
        if (0 < *(int *)((long)plVar2 + 0x1c)) {
          lVar16 = 0;
          do {
            lVar5 = *(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                             (long)*(int *)(plVar2[4] + lVar16 * 4) * 8);
            pDVar9 = Cudd_bddIthVar(pDVar7,(int)lVar16);
            st__insert(psVar8,(char *)pDVar9,*(char **)(lVar5 + 0x40));
            lVar16 = lVar16 + 1;
          } while (lVar16 < *(int *)((long)plVar2 + 0x1c));
        }
        pAVar12 = Abc_NodeBddToMuxes_rec
                            (pDVar7,(DdNode *)(uVar4 & 0xfffffffffffffffe),pNtkNew,psVar8);
        st__free_table(psVar8);
        if ((uVar4 & 1) != 0) {
          pAVar12 = Abc_NtkCreateNodeInv(pNtkNew,pAVar12);
        }
        if (plVar2[8] != 0) {
          __assert_fail("pNode->pCopy == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNtbdd.c"
                        ,0xbb,"void Abc_NtkBddToMuxesPerform(Abc_Ntk_t *, Abc_Ntk_t *)");
        }
        plVar2[8] = (long)pAVar12;
        lVar15 = lVar15 + 1;
      } while (lVar15 < pVVar13->nSize);
    }
    if (pVVar13->pArray != (void **)0x0) {
      free(pVVar13->pArray);
      pVVar13->pArray = (void **)0x0;
    }
    if (pVVar13 != (Vec_Ptr_t *)0x0) {
      free(pVVar13);
    }
    Extra_ProgressBarStop(p);
    Abc_NtkFinalize(pNtk,pNtkNew);
  }
  else {
    if (pNtk->ntkType != ABC_NTK_STRASH) {
      __assert_fail("Abc_NtkIsStrash(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNtbdd.c"
                    ,0x111,"int Abc_NtkBddToMuxesPerformGlo(Abc_Ntk_t *, Abc_Ntk_t *, int)");
    }
    pDVar7 = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,Limit,1,1,0,0);
    if (pDVar7 == (DdManager *)0x0) {
      puts("Construction of global BDDs has failed.");
    }
    else {
      psVar8 = st__init_table(st__ptrcmp,st__ptrhash);
      pVVar13 = pNtkNew->vCis;
      if (0 < pVVar13->nSize) {
        lVar15 = 0;
        do {
          value = (char *)pVVar13->pArray[lVar15];
          pDVar9 = Cudd_bddIthVar(pDVar7,(int)lVar15);
          st__insert(psVar8,(char *)pDVar9,value);
          lVar15 = lVar15 + 1;
          pVVar13 = pNtkNew->vCis;
        } while (lVar15 < pVVar13->nSize);
      }
      pVVar13 = pNtk->vCos;
      if (0 < pVVar13->nSize) {
        lVar15 = 0;
        do {
          plVar2 = (long *)pVVar13->pArray[lVar15];
          if (*(int *)(*(long *)(*plVar2 + 0x1b0) + 4) < 8) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          piVar3 = *(int **)(*(long *)(*(long *)(*plVar2 + 0x1b0) + 8) + 0x38);
          if (*(void **)(piVar3 + 2) == (void *)0x0) {
            __assert_fail("p->pArrayPtr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                          ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
          }
          iVar6 = (int)plVar2[2];
          lVar16 = (long)iVar6;
          iVar1 = *piVar3;
          if (iVar1 <= iVar6) {
            iVar14 = iVar6 + 10;
            if (iVar6 < iVar1 * 2) {
              iVar14 = iVar1 * 2;
            }
            if (iVar1 < iVar14) {
              pvVar10 = realloc(*(void **)(piVar3 + 2),(long)iVar14 * 8);
              *(void **)(piVar3 + 2) = pvVar10;
              memset((void *)((long)pvVar10 + (long)*piVar3 * 8),0,
                     ((long)iVar14 - (long)*piVar3) * 8);
              *piVar3 = iVar14;
            }
          }
          if ((*(long *)(*(long *)(piVar3 + 2) + lVar16 * 8) == 0) &&
             (*(code **)(piVar3 + 8) != (code *)0x0)) {
            uVar11 = (**(code **)(piVar3 + 8))(*(undefined8 *)(piVar3 + 4));
            *(undefined8 *)(*(long *)(piVar3 + 2) + lVar16 * 8) = uVar11;
          }
          uVar4 = *(ulong *)(*(long *)(piVar3 + 2) + lVar16 * 8);
          pAVar12 = Abc_NodeBddToMuxes_rec
                              (pDVar7,(DdNode *)(uVar4 & 0xfffffffffffffffe),pNtkNew,psVar8);
          if ((uVar4 & 1) != 0) {
            pAVar12 = Abc_NtkCreateNodeInv(pNtkNew,pAVar12);
          }
          Abc_ObjAddFanin((Abc_Obj_t *)plVar2[8],pAVar12);
          lVar15 = lVar15 + 1;
          pVVar13 = pNtk->vCos;
        } while (lVar15 < pVVar13->nSize);
      }
      st__free_table(psVar8);
      Abc_NtkAttrFree(pNtk,7,0);
      Extra_StopManager(pDVar7);
      Abc_NtkCleanCopy(pNtk);
    }
    if (pDVar7 == (DdManager *)0x0) goto LAB_002e43a8;
  }
  iVar6 = Abc_NtkCheck(pNtkNew);
  if (iVar6 != 0) {
    return pNtkNew;
  }
  puts("Abc_NtkBddToMuxes: The network check has failed.");
LAB_002e43a8:
  Abc_NtkDelete(pNtkNew);
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkBddToMuxes( Abc_Ntk_t * pNtk, int fGlobal, int Limit )
{
    Abc_Ntk_t * pNtkNew;
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    if ( fGlobal ) 
    {
        if ( !Abc_NtkBddToMuxesPerformGlo( pNtk, pNtkNew, Limit ) )
        {
            Abc_NtkDelete( pNtkNew );
            return NULL;
        }
    }
    else
    {
        Abc_NtkBddToMuxesPerform( pNtk, pNtkNew );
        Abc_NtkFinalize( pNtk, pNtkNew );
    }
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkBddToMuxes: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}